

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O1

void fiddle_tilde_setup(void)

{
  t_symbol *ptVar1;
  _class *p_Var2;
  
  ptVar1 = gensym("fiddle~");
  p_Var2 = class_new(ptVar1,sigfiddle_new,sigfiddle_ff,0x360,0,A_DEFFLOAT,6,6,6,0);
  sigfiddle_class = p_Var2;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,sigfiddle_dsp,ptVar1,A_NULL);
  p_Var2 = sigfiddle_class;
  ptVar1 = gensym("debug");
  class_addmethod(p_Var2,sigfiddle_debug,ptVar1,A_NULL);
  p_Var2 = sigfiddle_class;
  ptVar1 = gensym("npoints");
  class_addmethod(p_Var2,sigfiddle_setnpoints,ptVar1,A_FLOAT,0);
  p_Var2 = sigfiddle_class;
  ptVar1 = gensym("amp-range");
  class_addmethod(p_Var2,sigfiddle_amprange,ptVar1,A_FLOAT,1,0);
  p_Var2 = sigfiddle_class;
  ptVar1 = gensym("reattack");
  class_addmethod(p_Var2,sigfiddle_reattack,ptVar1,A_FLOAT,1,0);
  p_Var2 = sigfiddle_class;
  ptVar1 = gensym("vibrato");
  class_addmethod(p_Var2,sigfiddle_vibrato,ptVar1,A_FLOAT,1,0);
  p_Var2 = sigfiddle_class;
  ptVar1 = gensym("npartial");
  class_addmethod(p_Var2,sigfiddle_npartial,ptVar1,A_FLOAT,0);
  p_Var2 = sigfiddle_class;
  ptVar1 = gensym("auto");
  class_addmethod(p_Var2,sigfiddle_auto,ptVar1,A_FLOAT,0);
  p_Var2 = sigfiddle_class;
  ptVar1 = gensym("print");
  class_addmethod(p_Var2,sigfiddle_print,ptVar1,A_NULL);
  p_Var2 = sigfiddle_class;
  ptVar1 = gensym("signal");
  class_addmethod(p_Var2,nullfn,ptVar1,A_NULL);
  class_addbang(sigfiddle_class,sigfiddle_bang);
  ptVar1 = gensym("fiddle");
  class_addcreator(sigfiddle_new,ptVar1,A_DEFFLOAT,6,6,6,0);
  post(fiddle_version);
  return;
}

Assistant:

void fiddle_tilde_setup(void)
{
    sigfiddle_class = class_new(gensym("fiddle~"), (t_newmethod)sigfiddle_new,
        (t_method)sigfiddle_ff, sizeof(t_sigfiddle), 0,
            A_DEFFLOAT, A_DEFFLOAT, A_DEFFLOAT, A_DEFFLOAT, 0);
    class_addmethod(sigfiddle_class, (t_method)sigfiddle_dsp,
        gensym("dsp"), 0);
    class_addmethod(sigfiddle_class, (t_method)sigfiddle_debug,
        gensym("debug"), 0);
    class_addmethod(sigfiddle_class, (t_method)sigfiddle_setnpoints,
        gensym("npoints"), A_FLOAT, 0);
    class_addmethod(sigfiddle_class, (t_method)sigfiddle_amprange,
        gensym("amp-range"), A_FLOAT, A_FLOAT, 0);
    class_addmethod(sigfiddle_class, (t_method)sigfiddle_reattack,
        gensym("reattack"), A_FLOAT, A_FLOAT, 0);
    class_addmethod(sigfiddle_class, (t_method)sigfiddle_vibrato,
        gensym("vibrato"), A_FLOAT, A_FLOAT, 0);
    class_addmethod(sigfiddle_class, (t_method)sigfiddle_npartial,
        gensym("npartial"), A_FLOAT, 0);
    class_addmethod(sigfiddle_class, (t_method)sigfiddle_auto,
        gensym("auto"), A_FLOAT, 0);
    class_addmethod(sigfiddle_class, (t_method)sigfiddle_print,
        gensym("print"), 0);
    class_addmethod(sigfiddle_class, nullfn, gensym("signal"), 0);
    class_addbang(sigfiddle_class, sigfiddle_bang);
    class_addcreator((t_newmethod)sigfiddle_new, gensym("fiddle"),
        A_DEFFLOAT, A_DEFFLOAT, A_DEFFLOAT, A_DEFFLOAT, 0);
    post(fiddle_version);
}